

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness
          (DescriptorBuilder *this,EnumDescriptorProto *proto,EnumDescriptor *result)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  Edition EVar4;
  pointer prVar5;
  EnumOptions *options;
  FileDescriptor *this_00;
  EnumValueDescriptorProto *pEVar6;
  string_view sVar7;
  string_view __y;
  VoidPtr local_170;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_168;
  string_view local_160;
  undefined4 local_14c;
  VoidPtr local_148;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_140;
  string_view local_138;
  undefined1 local_128 [8];
  anon_class_16_2_17ec71fb make_error;
  undefined1 local_f0 [7];
  bool inserted;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
  insert_result;
  string local_c8;
  undefined1 local_a8 [8];
  string stripped;
  EnumValueDescriptor *value;
  int i;
  undefined1 local_70 [8];
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  values;
  undefined1 local_40 [8];
  PrefixRemover remover;
  EnumDescriptor *result_local;
  EnumDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  remover.prefix_.field_2._8_8_ = result;
  join_0x00000010_0x00000000_ = EnumDescriptor::name(result);
  anon_unknown_24::PrefixRemover::PrefixRemover
            ((PrefixRemover *)local_40,join_0x00000010_0x00000000_);
  absl::lts_20250127::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::flat_hash_map((flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                   *)local_70);
  value._0_4_ = 0;
  do {
    iVar2 = EnumDescriptor::value_count((EnumDescriptor *)remover.prefix_.field_2._8_8_);
    if (iVar2 <= (int)value) {
      absl::lts_20250127::
      flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
      ::~flat_hash_map((flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                        *)local_70);
      anon_unknown_24::PrefixRemover::~PrefixRemover((PrefixRemover *)local_40);
      return;
    }
    stripped.field_2._8_8_ =
         (size_type)EnumDescriptor::value(remover.prefix_.field_2._8_8_,(int)value);
    sVar7 = EnumValueDescriptor::name((EnumValueDescriptor *)stripped.field_2._8_8_);
    insert_result._16_8_ = sVar7._M_len;
    protobuf::(anonymous_namespace)::PrefixRemover::MaybeRemove_abi_cxx11_(&local_c8,local_40,sVar7)
    ;
    anon_unknown_24::EnumValueToPascalCase((string *)local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
    ::
    try_emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*&,_0>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
                *)local_f0,
               (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                *)local_70,(key_arg<std::__cxx11::basic_string<char>_> *)local_a8,
               (EnumValueDescriptor **)((long)&stripped.field_2 + 8));
    if ((insert_result.first.field_1._0_1_ & 1) == 0) {
      prVar5 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
               ::iterator::operator->((iterator *)local_f0);
      sVar7 = EnumValueDescriptor::name((EnumValueDescriptor *)prVar5->second);
      __y = EnumValueDescriptor::name((EnumValueDescriptor *)stripped.field_2._8_8_);
      make_error.insert_result =
           (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>::iterator,_bool>
            *)__y._M_len;
      bVar1 = std::operator!=(sVar7,__y);
      if (!bVar1) goto LAB_00206c0a;
      prVar5 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
               ::iterator::operator->((iterator *)local_f0);
      iVar2 = EnumValueDescriptor::number((EnumValueDescriptor *)prVar5->second);
      iVar3 = EnumValueDescriptor::number((EnumValueDescriptor *)stripped.field_2._8_8_);
      if (iVar2 == iVar3) goto LAB_00206c0a;
      local_128 = (undefined1  [8])((long)&stripped.field_2 + 8);
      make_error.value = (EnumValueDescriptor **)local_f0;
      if ((this->pool_->deprecated_legacy_json_field_conflicts_ & 1U) == 0) {
        options = EnumDescriptor::options((EnumDescriptor *)remover.prefix_.field_2._8_8_);
        bVar1 = anon_unknown_24::IsLegacyJsonFieldConflictEnabled<google::protobuf::EnumOptions>
                          (options);
        if (bVar1) goto LAB_00206a42;
LAB_00206b76:
        sVar7 = EnumValueDescriptor::full_name((EnumValueDescriptor *)stripped.field_2._8_8_);
        local_160 = sVar7;
        pEVar6 = EnumDescriptorProto::value(proto,(int)value);
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_170,
                   (anon_class_16_2_17ec71fb *)local_128);
        make_error_01.invoker_ = p_Stack_168;
        make_error_01.ptr_.obj = local_170.obj;
        AddError(this,local_160,&pEVar6->super_Message,NAME,make_error_01);
        goto LAB_00206c0a;
      }
LAB_00206a42:
      this_00 = EnumDescriptor::file((EnumDescriptor *)remover.prefix_.field_2._8_8_);
      EVar4 = FileDescriptor::edition(this_00);
      if (EVar4 != EDITION_PROTO2) goto LAB_00206b76;
      sVar7 = EnumValueDescriptor::full_name((EnumValueDescriptor *)stripped.field_2._8_8_);
      local_138 = sVar7;
      pEVar6 = EnumDescriptorProto::value(proto,(int)value);
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_148,
                 (anon_class_16_2_17ec71fb *)local_128);
      make_error_00.invoker_ = p_Stack_140;
      make_error_00.ptr_.obj = local_148.obj;
      AddWarning(this,local_138,&pEVar6->super_Message,NAME,make_error_00);
      local_14c = 4;
    }
    else {
LAB_00206c0a:
      local_14c = 0;
    }
    std::__cxx11::string::~string((string *)local_a8);
    value._0_4_ = (int)value + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::CheckEnumValueUniqueness(
    const EnumDescriptorProto& proto, const EnumDescriptor* result) {

  // Check that enum labels are still unique when we remove the enum prefix from
  // values that have it.
  //
  // This will fail for something like:
  //
  //   enum MyEnum {
  //     MY_ENUM_FOO = 0;
  //     FOO = 1;
  //   }
  //
  // By enforcing this reasonable constraint, we allow code generators to strip
  // the prefix and/or PascalCase it without creating conflicts.  This can lead
  // to much nicer language-specific enums like:
  //
  //   enum NameType {
  //     FirstName = 1,
  //     LastName = 2,
  //   }
  //
  // Instead of:
  //
  //   enum NameType {
  //     NAME_TYPE_FIRST_NAME = 1,
  //     NAME_TYPE_LAST_NAME = 2,
  //   }
  PrefixRemover remover(result->name());
  absl::flat_hash_map<std::string, const EnumValueDescriptor*> values;
  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    std::string stripped =
        EnumValueToPascalCase(remover.MaybeRemove(value->name()));
    auto insert_result = values.try_emplace(stripped, value);
    bool inserted = insert_result.second;

    // We don't throw the error if the two conflicting symbols are identical, or
    // if they map to the same number.  In the former case, the normal symbol
    // duplication error will fire so we don't need to (and its error message
    // will make more sense). We allow the latter case so users can create
    // aliases which add or remove the prefix (code generators that do prefix
    // stripping should de-dup the labels in this case).
    if (!inserted && insert_result.first->second->name() != value->name() &&
        insert_result.first->second->number() != value->number()) {
      auto make_error = [&] {
        return absl::StrFormat(
            "Enum name %s has the same name as %s if you ignore case and strip "
            "out the enum name prefix (if any). (If you are using allow_alias, "
            "please assign the same number to each enum value name.)",
            value->name(), insert_result.first->second->name());
      };
      // There are proto2 enums out there with conflicting names, so to preserve
      // compatibility we issue only a warning for proto2.
      if ((pool_->deprecated_legacy_json_field_conflicts_ ||
           IsLegacyJsonFieldConflictEnabled(result->options())) &&
          result->file()->edition() == Edition::EDITION_PROTO2) {
        AddWarning(value->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NAME, make_error);
        continue;
      }
      AddError(value->full_name(), proto.value(i),
               DescriptorPool::ErrorCollector::NAME, make_error);
    }
  }
}